

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O2

int zt_opt_verror_default(int code,char *fmt,__va_list_tag *ap)

{
  char *__ptr;
  
  if ((code == 0) && (fmt == (char *)0x0)) {
    code = -1;
  }
  else {
    __ptr = zt_opt_verror_str(code,fmt,ap);
    fprintf(_stderr,"%s\n",__ptr);
    free(__ptr);
  }
  return code;
}

Assistant:

int
zt_opt_verror_default(int code, char * fmt, va_list ap) {
    char * msg = NULL;

    if (!code && !fmt) {
        /* no code or format equates to calling exit */
        return -1;
    }

    msg = zt_opt_verror_str(code, fmt, ap);
    fprintf(stderr, "%s\n", msg);
    zt_free(msg);
    return code;
}